

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl::
~IncomingRpcMessageImpl(IncomingRpcMessageImpl *this)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  word *pwVar4;
  
  (this->message).super_UnalignedFlatArrayMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__UnalignedFlatArrayMessageReader_00625be8;
  pAVar1 = (this->message).super_UnalignedFlatArrayMessageReader.moreSegments.ptr;
  if (pAVar1 != (ArrayPtr<const_capnp::word> *)0x0) {
    sVar2 = (this->message).super_UnalignedFlatArrayMessageReader.moreSegments.size_;
    (this->message).super_UnalignedFlatArrayMessageReader.moreSegments.ptr =
         (ArrayPtr<const_capnp::word> *)0x0;
    (this->message).super_UnalignedFlatArrayMessageReader.moreSegments.size_ = 0;
    pAVar3 = (this->message).super_UnalignedFlatArrayMessageReader.moreSegments.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pAVar1,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&this->message)
  ;
  pwVar4 = (this->data).ptr;
  if (pwVar4 != (word *)0x0) {
    sVar2 = (this->data).size_;
    (this->data).ptr = (word *)0x0;
    (this->data).size_ = 0;
    pAVar3 = (this->data).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pwVar4,8,sVar2,sVar2,0);
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

IncomingRpcMessageImpl(kj::Array<word> data)
          : data(kj::mv(data)),
            message(this->data) {}